

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SingleKdTreeIndex::SerializeWithCachedSizes
          (SingleKdTreeIndex *this,CodedOutputStream *output)

{
  int32 iVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SingleKdTreeIndex *this_local;
  
  iVar1 = leafsize(this);
  if (iVar1 != 0) {
    iVar1 = leafsize(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(1,iVar1,output);
  }
  return;
}

Assistant:

void SingleKdTreeIndex::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SingleKdTreeIndex)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int32 leafSize = 1;
  if (this->leafsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(1, this->leafsize(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SingleKdTreeIndex)
}